

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void cleanup_regions(REGIONS *regions,int *num_regions)

{
  int k;
  uint local_24;
  
  local_24 = 0;
  while ((int)local_24 < *num_regions) {
    if ((((int)local_24 < 1) ||
        (regions[(ulong)local_24 - 1].type != regions[local_24].type ||
         regions[local_24].type == SCENECUT_REGION)) &&
       (regions[(int)local_24].start <= regions[(int)local_24].last)) {
      local_24 = local_24 + 1;
    }
    else {
      remove_region(0,regions,num_regions,(int *)&local_24);
    }
  }
  return;
}

Assistant:

static void cleanup_regions(REGIONS *regions, int *num_regions) {
  int k = 0;
  while (k < *num_regions) {
    if ((k > 0 && regions[k - 1].type == regions[k].type &&
         regions[k].type != SCENECUT_REGION) ||
        regions[k].last < regions[k].start) {
      remove_region(0, regions, num_regions, &k);
    } else {
      k++;
    }
  }
}